

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O2

int IDABBDPrecGetNumGfnEvals(void *ida_mem,long *ngevalsBBDP)

{
  long lVar1;
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0x19b;
  }
  else if (*(long *)((long)ida_mem + 0x760) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    error_code = -2;
    line = 0x1a3;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)ida_mem + 0x760) + 0x118);
    if (lVar1 != 0) {
      *ngevalsBBDP = *(long *)(lVar1 + 0x90);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.";
    error_code = -5;
    line = 0x1ab;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDABBDPrecGetNumGfnEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDABBDPrecGetNumGfnEvals(void* ida_mem, long int* ngevalsBBDP)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  if (idals_mem->pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (IDALS_PMEM_NULL);
  }
  pdata = (IBBDPrecData)idals_mem->pdata;

  *ngevalsBBDP = pdata->nge;

  return (IDALS_SUCCESS);
}